

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O1

Scope * __thiscall
FactoredQLastTimeStepOrElse::GetAgentScopeForLQF
          (FactoredQLastTimeStepOrElse *this,Index e,Index stage)

{
  pointer pSVar1;
  ulong uVar2;
  long lVar3;
  E *this_00;
  ulong uVar4;
  
  uVar2 = (ulong)e;
  lVar3 = (**(code **)(*(long *)&this->super_QFunctionForFactoredDecPOMDP + 0x78))
                    (&this->super_QFunctionForFactoredDecPOMDP);
  if (*(int *)(lVar3 + 0x18) - 1U != stage) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"FactoredQLastTimeStepOrElse::GetNrLQFs called for stage other than the last!");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  pSVar1 = (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
    return pSVar1 + uVar2;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const Scope& FactoredQLastTimeStepOrElse::GetAgentScopeForLQF(Index e,Index stage) const
{
    Index last_stage = GetPUF()->GetHorizon() - 1;
    if(stage != last_stage)
        throw E("FactoredQLastTimeStepOrElse::GetNrLQFs called for stage other than the last!");
    return _m_agentScopes.at(e);
}